

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O3

void cmExecuteProcessCommandAppend
               (vector<char,_std::allocator<char>_> *output,char *data,int length)

{
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)output,
             (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_finish,data,data + length);
  return;
}

Assistant:

void cmExecuteProcessCommandAppend(std::vector<char>& output, const char* data,
                                   int length)
{
#if defined(__APPLE__)
  // HACK on Apple to work around bug with inserting at the
  // end of an empty vector.  This resulted in random failures
  // that were hard to reproduce.
  if (output.empty() && length > 0) {
    output.push_back(data[0]);
    ++data;
    --length;
  }
#endif
  cmAppend(output, data, data + length);
}